

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::ICRS2CIRS(CESkyCoord *in_icrs,CESkyCoord *out_cirs,CEDate *date)

{
  long *in_RDX;
  long *in_RSI;
  CEDate *in_RDI;
  double date_00;
  double dVar1;
  CEAngle CVar2;
  double return_dec;
  double return_ra;
  double tdb2;
  double tdb1;
  double eo;
  double *in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  CEDateType date_format;
  double in_stack_fffffffffffffec8;
  CEDate *this;
  undefined4 local_11c;
  double *in_stack_fffffffffffffee8;
  undefined1 local_108 [16];
  undefined1 local_f8 [64];
  CEAngle local_b8 [2];
  undefined1 local_98 [64];
  CEAngle local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  long *local_10;
  CEDate *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_28 = 0;
  local_30 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = (**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TDB(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(double *)0x16378e);
  local_40 = 0;
  local_48 = 0;
  this = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(this,in_stack_fffffffffffffec8,date_format);
  (*this->_vptr_CEDate[3])(&local_58,this,local_98);
  date_00 = CEAngle::Rad(&local_58);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(this,date_00,(CEDateType)((ulong)dVar1 >> 0x20));
  (*local_8->_vptr_CEDate[4])(local_b8,local_8,local_f8);
  dVar1 = CEAngle::Rad(local_b8);
  iauAtci13(date_00,dVar1,0,0,0,0,local_28,local_30,&local_40,&local_48,local_20);
  CEAngle::~CEAngle((CEAngle *)0x1638b4);
  CEDate::~CEDate((CEDate *)0x1638be);
  CEAngle::~CEAngle((CEAngle *)0x1638cb);
  CEDate::~CEDate((CEDate *)0x1638d8);
  CEAngle::Rad(in_stack_fffffffffffffee8);
  CVar2 = CEAngle::Rad(in_stack_fffffffffffffee8);
  local_11c = 0;
  (**(code **)(*local_10 + 0x28))
            (CVar2.angle_,local_10,local_108,&stack0xfffffffffffffee8,&local_11c);
  CEAngle::~CEAngle((CEAngle *)0x16393a);
  CEAngle::~CEAngle((CEAngle *)0x163944);
  return;
}

Assistant:

void CESkyCoord::ICRS2CIRS(const CESkyCoord& in_icrs,
                           CESkyCoord*       out_cirs,
                           const CEDate&     date)
{
    // Store the equation of the origins
    double eo; // Equation of the origins
    
    // Use the sofa library to convert these coordinates
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
    double return_ra(0.0);
    double return_dec(0.0);
    iauAtci13(in_icrs.XCoord().Rad(), 
                in_icrs.YCoord().Rad(),
                0.0, 0.0, 0.0, 0.0, 
                tdb1, tdb2, 
                &return_ra, &return_dec, &eo);
    
    // Subtract the equation of the origins if J2000 coordinates are desired
    //*return_ra -= eo;

    // Set the output cirs coordinates
    out_cirs->SetCoordinates(CEAngle::Rad(return_ra),
                             CEAngle::Rad(return_dec),
                             CESkyCoordType::CIRS);

    return;
}